

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record_property_tests.cpp
# Opt level: O0

bool CheckProperty(TestResult *tr,char *key,char *value)

{
  undefined8 expr2;
  bool bVar1;
  char *pcVar2;
  TestProperty *pTVar3;
  UnitTest *this;
  type **in_stack_fffffffffffff4c8;
  AssertionHelper local_ab0;
  bool local_a7a;
  AssertionReturnType<bool> local_a79;
  Fixed local_a78;
  ReturnTypedFixed<bool> local_8f0;
  undefined1 local_760 [8];
  AssertionResult iutest_ar_2;
  bool local_702;
  AssertionReturnType<bool> local_701;
  Fixed local_700;
  ReturnTypedFixed<bool> local_578;
  undefined1 local_3e8 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_3b8;
  bool local_382;
  AssertionReturnType<bool> local_381;
  Fixed local_380;
  ReturnTypedFixed<bool> local_1f8;
  int local_58 [2];
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  char *value_local;
  char *key_local;
  TestResult *tr_local;
  
  iutest_ar._32_8_ = value;
  if (tr != (TestResult *)0x0) {
    iutest::detail::AlwaysZero();
    local_58[1] = 1;
    local_58[0] = iutest::TestResult::test_property_count(tr);
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_50,"1","tr->test_property_count()",local_58 + 1,local_58);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
    if (!bVar1) {
      memset(&local_380,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_380);
      local_382 = false;
      local_381 = iutest::AssertionReturn<bool>(&local_382);
      iutest::AssertionHelper::Fixed::operator<<(&local_1f8,&local_380,&local_381);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_50);
      iutest::AssertionHelper::AssertionHelper
                (&local_3b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
                 ,0x29,pcVar2,kFatalFailure);
      tr_local._7_1_ = iutest::AssertionHelper::operator=(&local_3b8,&local_1f8);
      iutest::AssertionHelper::~AssertionHelper(&local_3b8);
      iutest::AssertionHelper::ReturnTypedFixed<bool>::~ReturnTypedFixed(&local_1f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_380);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    if (iutest_ar_1._36_4_ != 0) goto LAB_0012cfdb;
    iutest::detail::AlwaysZero();
    pTVar3 = iutest::TestResult::GetTestProperty(tr,0);
    pcVar2 = iutest::TestProperty::key(pTVar3);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_3e8,(internal *)0x15361b,"tr->GetTestProperty(0).key()",key,
               pcVar2,(char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffff4c8)
    ;
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
    if (!bVar1) {
      memset(&local_700,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_700);
      local_702 = false;
      local_701 = iutest::AssertionReturn<bool>(&local_702);
      iutest::AssertionHelper::Fixed::operator<<(&local_578,&local_700,&local_701);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_3e8);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
                 ,0x2a,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_578);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::ReturnTypedFixed<bool>::~ReturnTypedFixed(&local_578);
      iutest::AssertionHelper::Fixed::~Fixed(&local_700);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
    iutest::detail::AlwaysZero();
    expr2 = iutest_ar._32_8_;
    pTVar3 = iutest::TestResult::GetTestProperty(tr,0);
    pcVar2 = iutest::TestProperty::value(pTVar3);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_760,(internal *)"value","tr->GetTestProperty(0).value()",
               (char *)expr2,pcVar2,(char *)&iutest_type_traits::enabler_t<void>::value,
               in_stack_fffffffffffff4c8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
    if (!bVar1) {
      memset(&local_a78,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_a78);
      local_a7a = false;
      local_a79 = iutest::AssertionReturn<bool>(&local_a7a);
      iutest::AssertionHelper::Fixed::operator<<(&local_8f0,&local_a78,&local_a79);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_760);
      iutest::AssertionHelper::AssertionHelper
                (&local_ab0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
                 ,0x2b,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_ab0,&local_8f0);
      iutest::AssertionHelper::~AssertionHelper(&local_ab0);
      iutest::AssertionHelper::ReturnTypedFixed<bool>::~ReturnTypedFixed(&local_8f0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_a78);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  }
  this = iutest::UnitTest::GetInstance();
  tr_local._7_1_ = iutest::UnitTest::Passed(this);
LAB_0012cfdb:
  return (bool)(tr_local._7_1_ & 1);
}

Assistant:

bool CheckProperty(const ::iutest::TestResult* tr, const char* key, const char* value)
{
#if IUTEST_USE_THROW_ON_ASSERTION_FAILURE
    try {
#endif

#if IUTEST_HAS_ASSERTION_RETURN
    if( tr != NULL )
    {
        IUTEST_ASSERT_EQ(1, tr->test_property_count()) << ::iutest::AssertionReturn(false);
        IUTEST_EXPECT_STREQ(key, tr->GetTestProperty(0).key()) << ::iutest::AssertionReturn(false);
        IUTEST_EXPECT_STREQ(value, tr->GetTestProperty(0).value()) << ::iutest::AssertionReturn(false);
    }
#else
    CheckProperty_(tr, key, value);
#endif

#if IUTEST_USE_THROW_ON_ASSERTION_FAILURE
    } catch(...) {}
#endif
    return ::iutest::UnitTest::GetInstance()->Passed();
}